

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O1

int eval_expression(coda_cursor *cursor)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char *pcVar8;
  char *__format;
  ulong uVar9;
  long length;
  int value;
  uint local_50;
  undefined4 uStack_4c;
  char *local_48 [3];
  
  switch(expr_type) {
  case coda_expression_boolean:
    iVar2 = coda_expression_eval_bool(eval_expr,cursor,local_48);
    if (iVar2 == 0) {
      pcVar8 = "true";
      if ((int)local_48[0] == 0) {
        pcVar8 = "false";
      }
      goto LAB_00101eae;
    }
    puVar4 = (undefined4 *)coda_get_errno();
    uVar5 = coda_errno_to_string(*puVar4);
    pcVar8 = "cannot evaluate boolean expression (%s)";
LAB_00101d20:
    coda_set_error(0xfffffe6f,pcVar8,uVar5);
    break;
  case coda_expression_integer:
    iVar2 = coda_expression_eval_integer(eval_expr,cursor,&local_50);
    if (iVar2 != 0) {
      puVar4 = (undefined4 *)coda_get_errno();
      uVar5 = coda_errno_to_string(*puVar4);
      pcVar8 = "cannot evaluate integer expression (%s)";
      goto LAB_00101d20;
    }
    pcVar8 = (char *)local_48;
    coda_str64(CONCAT44(uStack_4c,local_50),pcVar8);
LAB_00101eae:
    puts(pcVar8);
    break;
  case coda_expression_float:
    iVar2 = coda_expression_eval_float(eval_expr,cursor,local_48);
    if (iVar2 != 0) {
      puVar4 = (undefined4 *)coda_get_errno();
      uVar5 = coda_errno_to_string(*puVar4);
      pcVar8 = "cannot evaluate floating point expression (%s)";
      goto LAB_00101d20;
    }
    printf("%.16g\n",local_48[0]);
    break;
  case coda_expression_string:
    local_48[0] = (char *)0x0;
    iVar2 = coda_expression_eval_string(eval_expr,cursor,local_48,&local_50);
    pcVar8 = local_48[0];
    if (iVar2 != 0) {
      puVar4 = (undefined4 *)coda_get_errno();
      uVar5 = coda_errno_to_string(*puVar4);
      pcVar8 = "cannot evaluate string expression (%s)";
      goto LAB_00101d20;
    }
    if (local_48[0] != (char *)0x0 && local_50 != 0) {
      if ((int)local_50 < 0) {
        sVar6 = strlen(local_48[0]);
        local_50 = (uint)sVar6;
      }
      if (0 < (int)local_50) {
        uVar9 = 0;
        do {
          bVar1 = pcVar8[uVar9];
          if (0x1a < bVar1) {
            if (bVar1 == 0x5c) {
              __format = "\\\\";
            }
            else if (bVar1 == 0x22) {
              __format = "\\\"";
            }
            else {
              if (bVar1 != 0x1b) goto switchD_00101dab_default;
              __format = "\\e";
            }
            goto LAB_00101e41;
          }
          switch(bVar1) {
          case 7:
            __format = "\\a";
            break;
          case 8:
            __format = "\\b";
            break;
          case 9:
            __format = "\\t";
            break;
          case 10:
            __format = "\\n";
            break;
          case 0xb:
            __format = "\\v";
            break;
          case 0xc:
            __format = "\\f";
            break;
          case 0xd:
            __format = "\\r";
            break;
          default:
switchD_00101dab_default:
            ppuVar7 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar7 + (long)(char)bVar1 * 2 + 1) & 0x40) == 0) {
              printf("\\%03o",(ulong)bVar1);
            }
            else {
              putchar((int)(char)bVar1);
            }
            goto LAB_00101e48;
          }
LAB_00101e41:
          printf(__format);
LAB_00101e48:
          uVar9 = uVar9 + 1;
        } while (local_50 != uVar9);
      }
    }
    putchar(10);
    if (local_48[0] != (char *)0x0) {
      free(local_48[0]);
    }
    break;
  case coda_expression_node:
  case coda_expression_void:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codaeval/codaeval.c"
                  ,0xe6,"int eval_expression(coda_cursor *)");
  default:
    goto switchD_00101c55_default;
  }
  iVar3 = -1;
  if (iVar2 == 0) {
switchD_00101c55_default:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int eval_expression(coda_cursor *cursor)
{
    switch (expr_type)
    {
        case coda_expression_boolean:  /* boolean */
            {
                int value;

                if (coda_expression_eval_bool(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate boolean expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                printf("%s\n", (value ? "true" : "false"));
            }
            break;
        case coda_expression_integer:  /* integer */
            {
                int64_t value;
                char s[21];

                if (coda_expression_eval_integer(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate integer expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                coda_str64(value, s);
                printf("%s\n", s);
            }
            break;
        case coda_expression_float:    /* floating point */
            {
                double value;

                if (coda_expression_eval_float(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate floating point expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                printf("%.16g\n", value);
            }
            break;
        case coda_expression_string:   /* string */
            {
                char *value = NULL;
                long length;

                if (coda_expression_eval_string(eval_expr, cursor, &value, &length))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate string expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                generate_escaped_string(value, length);
                printf("\n");
                if (value != NULL)
                {
                    free(value);
                }
            }
            break;
        case coda_expression_void:
        case coda_expression_node:
            assert(0);
            exit(1);
    }

    return 0;
}